

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O1

QList<QByteArray> * __thiscall
QMetaMethodBuilder::parameterTypes
          (QList<QByteArray> *__return_storage_ptr__,QMetaMethodBuilder *this)

{
  QMetaMethodBuilderPrivate *pQVar1;
  char *signature;
  
  pQVar1 = d_func(this);
  if (pQVar1 == (QMetaMethodBuilderPrivate *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QByteArray *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    signature = (pQVar1->signature).d.ptr;
    if (signature == (char *)0x0) {
      signature = "";
    }
    QMetaObjectPrivate::parameterTypeNamesFromSignature(__return_storage_ptr__,signature);
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QByteArray> QMetaMethodBuilder::parameterTypes() const
{
    QMetaMethodBuilderPrivate *d = d_func();
    if (d)
        return d->parameterTypes();
    else
        return QList<QByteArray>();
}